

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int setup_initial_encryption
              (ptls_cipher_suite_t *cs,st_quicly_cipher_context_t *ingress,
              st_quicly_cipher_context_t *egress,ptls_iovec_t cid,int is_client,ptls_iovec_t salt,
              quicly_conn_t *conn)

{
  int iVar1;
  undefined1 auStack_78 [72];
  
  iVar1 = ptls_hkdf_extract(cs->hash,auStack_78,salt,cid);
  if (iVar1 == 0) {
    if (ingress == (st_quicly_cipher_context_t *)0x0) {
      if (egress == (st_quicly_cipher_context_t *)0x0) {
        iVar1 = 0;
        goto LAB_00119a4b;
      }
    }
    else {
      iVar1 = setup_initial_key(ingress,cs,auStack_78,
                                setup_initial_encryption::labels[(uint)is_client],0,conn);
      if (egress == (st_quicly_cipher_context_t *)0x0 || iVar1 != 0) goto LAB_00119a4b;
    }
    iVar1 = setup_initial_key(egress,cs,auStack_78,setup_initial_encryption::labels[is_client == 0],
                              1,conn);
    if ((ingress != (st_quicly_cipher_context_t *)0x0) && (iVar1 != 0)) {
      ptls_aead_free(ingress->aead);
      ptls_cipher_free(ingress->header_protection);
    }
  }
LAB_00119a4b:
  (*ptls_clear_memory)(auStack_78,0x40);
  return iVar1;
}

Assistant:

static int setup_initial_encryption(ptls_cipher_suite_t *cs, struct st_quicly_cipher_context_t *ingress,
                                    struct st_quicly_cipher_context_t *egress, ptls_iovec_t cid, int is_client, ptls_iovec_t salt,
                                    quicly_conn_t *conn)
{
    static const char *labels[2] = {"client in", "server in"};
    uint8_t secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    /* extract master secret */
    if ((ret = ptls_hkdf_extract(cs->hash, secret, salt, cid)) != 0)
        goto Exit;

    /* create aead contexts */
    if (ingress != NULL && (ret = setup_initial_key(ingress, cs, secret, labels[is_client], 0, conn)) != 0)
        goto Exit;
    if (egress != NULL && (ret = setup_initial_key(egress, cs, secret, labels[!is_client], 1, conn)) != 0) {
        if (ingress != NULL)
            dispose_cipher(ingress);
        goto Exit;
    }

Exit:
    ptls_clear_memory(secret, sizeof(secret));
    return ret;
}